

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChCoordsys<double>::TransformParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChCoordsys<double> *this,
          ChVector<double> *parent)

{
  undefined1 local_28 [16];
  double local_18;
  
  local_28 = vsubpd_avx(*(undefined1 (*) [16])parent->m_data,
                        *(undefined1 (*) [16])(this->pos).m_data);
  local_18 = parent->m_data[2] - (this->pos).m_data[2];
  ChQuaternion<double>::RotateBack(&this->rot,(ChVector<double> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> TransformParentToLocal(const ChVector<Real>& parent) const { return rot.RotateBack(parent - pos); }